

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O0

void __thiscall ChebTools::LMatrixLibrary::build(LMatrixLibrary *this,size_t N)

{
  Scalar SVar1;
  int iVar2;
  Scalar *pSVar3;
  mapped_type *this_00;
  undefined4 uVar4;
  double dVar5;
  bool local_8a;
  double p_k;
  double p_j;
  int k;
  int j;
  unsigned_long local_38;
  undefined1 local_30 [8];
  MatrixXd L;
  size_t N_local;
  LMatrixLibrary *this_local;
  undefined1 auVar6 [16];
  
  local_38 = N + 1;
  _k = N + 1;
  L.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = N;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_long,unsigned_long>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_30,&local_38,(unsigned_long *)&k);
  for (p_j._4_4_ = 0;
      (ulong)(long)p_j._4_4_ <=
      (ulong)L.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
      p_j._4_4_ = p_j._4_4_ + 1) {
    for (p_j._0_4_ = p_j._4_4_;
        (ulong)(long)p_j._0_4_ <=
        (ulong)L.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
        p_j._0_4_ = p_j._0_4_ + 1) {
      iVar2 = 1;
      if (p_j._4_4_ == 0 ||
          p_j._4_4_ ==
          L.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols) {
        iVar2 = 2;
      }
      local_8a = p_j._0_4_ == 0 ||
                 p_j._0_4_ ==
                 L.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
      ;
      auVar6._8_4_ = (int)((ulong)L.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                  .m_storage.m_cols >> 0x20);
      auVar6._0_8_ = L.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_cols;
      auVar6._12_4_ = 0x45300000;
      uVar4 = (undefined4)
              L.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
      dVar5 = cos((double)(((longdouble)p_j._0_4_ * _DAT_00203650 * (longdouble)p_j._4_4_) /
                          ((longdouble)
                           *(float *)(&DAT_002035f0 +
                                     (ulong)(L.
                                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                             .m_storage.m_cols < 0) * 4) +
                          (longdouble)
                          L.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                          m_storage.m_cols)));
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_30,
                          (long)p_j._4_4_,(long)p_j._0_4_);
      *pSVar3 = (2.0 / ((double)iVar2 * (double)(byte)(local_8a + 1) *
                       ((auVar6._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,uVar4) - 4503599627370496.0)))) * dVar5;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_30,
                          (long)p_j._4_4_,(long)p_j._0_4_);
      SVar1 = *pSVar3;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_30,
                          (long)p_j._0_4_,(long)p_j._4_4_);
      *pSVar3 = SVar1;
    }
  }
  this_00 = std::
            map<unsigned_long,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
            ::operator[](&this->matrices,
                         (key_type_conflict *)
                         &L.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                          m_storage.m_cols);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=
            (this_00,(Matrix<double,__1,__1,_0,__1,__1> *)local_30);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_30);
  return;
}

Assistant:

void build(std::size_t N) {
            Eigen::MatrixXd L(N + 1, N + 1); ///< Matrix of coefficients
            for (int j = 0; j <= N; ++j) {
                for (int k = j; k <= N; ++k) {
                    double p_j = (j == 0 || j == N) ? 2 : 1;
                    double p_k = (k == 0 || k == N) ? 2 : 1;
                    L(j, k) = 2.0 / (p_j*p_k*N)*cos((j*EIGEN_PI*k) / N);
                    // Exploit symmetry to fill in the symmetric elements in the matrix
                    L(k, j) = L(j, k);
                }
            }
            matrices[N] = L;
        }